

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

jpegls_errc charls::to_jpegls_errc(void)

{
  int iVar1;
  spiff_header *in_RSI;
  int *in_RDI;
  bool bStack_51;
  spiff_header *psStack_50;
  undefined1 *puStack_40;
  jpegls_error *error;
  bad_alloc *anon_var_0;
  
  puStack_40 = (undefined1 *)0x1170cd;
  __cxa_rethrow();
  psStack_50 = in_RSI;
  puStack_40 = &stack0xfffffffffffffff8;
  check_operation(*in_RDI == 1);
  bStack_51 = false;
  jpeg_stream_reader::read_header((jpeg_stream_reader *)(in_RDI + 2),psStack_50,&bStack_51);
  iVar1 = 3;
  if ((bStack_51 & 1U) != 0) {
    iVar1 = 2;
  }
  *in_RDI = iVar1;
  return (jpegls_errc)CONCAT71((int7)((ulong)in_RDI >> 8),bStack_51) & 0xffffff01;
}

Assistant:

inline jpegls_errc to_jpegls_errc() noexcept
{
    try
    {
        // re-trow the exception.
        throw;
    }
    catch (const jpegls_error& error)
    {
        return static_cast<jpegls_errc>(error.code().value());
    }
    catch (const std::bad_alloc&)
    {
        return jpegls_errc::not_enough_memory;
    }
    catch (...)
    {
        return jpegls_errc::unexpected_failure;
    }
}